

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_radix_tree.hpp
# Opt level: O1

coro_result * __thiscall
cinatra::radix_tree::get_coro
          (coro_result *__return_storage_ptr__,radix_tree *this,string *path,string *method)

{
  char cVar1;
  int iVar2;
  pointer psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  size_type sVar4;
  int iVar5;
  _Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
  *p_Var6;
  int start;
  bool bVar7;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  element_type *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_110 [2];
  _Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
  *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  _Alloc_hider local_d8;
  string *local_d0;
  undefined1 local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_118 = (this->root).super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  a_Stack_110[0]._M_pi =
       (this->root).super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_110[0]._M_pi)->_M_use_count = (a_Stack_110[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_110[0]._M_pi)->_M_use_count = (a_Stack_110[0]._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (int)path->_M_string_length;
  local_100 = (_Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
               *)__return_storage_ptr__;
  local_d8._M_p = (pointer)this;
  local_d0 = method;
  if (0 < iVar2) {
    start = 0;
    do {
      if ((local_118->indices)._M_string_length == 0) {
LAB_001c70fa:
        *(undefined8 *)local_100 = 0;
        *(size_type *)(local_100 + 8) = 0;
        *(undefined8 *)(local_100 + 0x20) = 0;
        *(size_t *)(local_100 + 0x28) = 0;
        *(_Hash_node_base **)(local_100 + 0x10) = (_Hash_node_base *)0x0;
        *(size_type *)(local_100 + 0x18) = 0;
        *(__node_base_ptr *)(local_100 + 0x30) = (__node_base_ptr)0x0;
        *(_Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
          **)local_100 = local_100 + 0x30;
        *(size_type *)(local_100 + 8) = 1;
        *(undefined4 *)(local_100 + 0x20) = 0x3f800000;
        *(undefined8 *)(local_100 + 0x38) = 0;
        *(undefined8 *)(local_100 + 0x40) = 0;
        *(_Manager_type *)(local_100 + 0x48) = (_Manager_type)0x0;
        *(_Invoker_type *)(local_100 + 0x50) = (_Invoker_type)0x0;
        *(size_t *)(local_100 + 0x28) = 0;
        *(__node_base_ptr *)(local_100 + 0x30) = (__node_base_ptr)0x0;
        local_100[0x58] =
             (_Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
              )0x0;
        p_Var6 = local_100;
        goto LAB_001c71db;
      }
      cVar1 = *(local_118->indices)._M_dataplus._M_p;
      if (cVar1 == ':') {
        psVar3 = (local_118->children).
                 super__Vector_base<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_118 = (psVar3->
                    super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (a_Stack_110,
                   &(psVar3->
                    super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        iVar5 = find_pos((radix_tree *)local_d8._M_p,path,'/',start);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_88,path,(long)start,(long)(iVar5 - start));
        std::__detail::
        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&local_68,&local_118->path);
        get_coro();
        start = iVar5;
      }
      else {
        if (cVar1 == '*') {
          psVar3 = (local_118->children).
                   super__Vector_base<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_118 = (psVar3->
                      super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (a_Stack_110,
                     &(psVar3->
                      super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_f8,path,(long)start,0xffffffffffffffff);
          std::__detail::
          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&local_68,&local_118->path);
          get_coro();
          break;
        }
        radix_tree_node::get_child((radix_tree_node *)&local_f8,(char)local_118);
        sVar4 = local_f8._M_string_length;
        local_118 = (element_type *)local_f8._M_dataplus._M_p;
        this_00._M_pi = a_Stack_110[0]._M_pi;
        local_f8._M_dataplus._M_p = (pointer)0x0;
        local_f8._M_string_length = 0;
        a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
        }
        bVar7 = true;
        if ((local_118 != (element_type *)0x0) &&
           (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_a8,path,(long)start,*(size_type *)((long)local_118 + 8)),
           (_Invoker_type)local_a8._M_string_length == *(_Invoker_type *)((long)local_118 + 8))) {
          if ((_Invoker_type)local_a8._M_string_length == (_Invoker_type)0x0) {
            bVar7 = false;
          }
          else {
            iVar5 = bcmp(local_a8._M_dataplus._M_p,*(void **)local_118,local_a8._M_string_length);
            bVar7 = iVar5 != 0;
          }
        }
        if ((local_118 != (element_type *)0x0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2)) {
          operator_delete(local_a8._M_dataplus._M_p,
                          (ulong)(local_a8.field_2._M_allocated_capacity + 1));
        }
        if (bVar7) goto LAB_001c70fa;
        start = start + (int)*(size_type *)((long)local_118 + 8);
      }
    } while (start < iVar2);
  }
  radix_tree_node::get_coro_handler
            ((function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
              *)local_c8,local_118,local_d0);
  p_Var6 = local_100;
  std::
  _Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
  ::
  _Tuple_impl<std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&,void>
            (local_100,
             (function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
              *)local_c8,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_68);
  p_Var6[0x58] = (_Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                  )0x1;
  if ((_func_void *)local_c8._16_8_ != (_func_void *)0x0) {
    (*(code *)local_c8._16_8_)(local_c8,local_c8,3);
  }
LAB_001c71db:
  if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return (coro_result *)p_Var6;
}

Assistant:

coro_result get_coro(const std::string &path, const std::string &method) {
    std::unordered_map<std::string, std::string> params;
    auto root = this->root;

    int i = 0, n = path.size(), p;

    while (i < n) {
      if (root->indices.empty())
        return coro_result();

      if (root->indices[0] == type_colon) {
        root = root->children[0];

        p = find_pos(path, type_slash, i);
        params[root->path] = path.substr(i, p - i);
        i = p;
      }
      else if (root->indices[0] == type_asterisk) {
        root = root->children[0];
        params[root->path] = path.substr(i);
        break;
      }
      else {
        root = root->get_child(path[i]);
        if (!root || path.substr(i, root->path.size()) != root->path)
          return coro_result();
        i += root->path.size();
      }
    }

    return coro_result{true, root->get_coro_handler(method), params};
  }